

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pragmaVtabFilter(sqlite3_vtab_cursor *pVtabCursor,int idxNum,char *idxStr,int argc,
                    sqlite3_value **argv)

{
  byte bVar1;
  sqlite3_vtab *psVar2;
  int iVar3;
  void *pvVar4;
  sqlite3_vtab *psVar5;
  char *pcVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = pVtabCursor->pVtab;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pragmaVtabCursorClear((PragmaVtabCursor *)pVtabCursor);
  if (0 < argc) {
    bVar1 = *(byte *)(*(long *)&psVar2[1].nRef + 9);
    uVar7 = 0;
    do {
      pvVar4 = sqlite3ValueText(argv[uVar7],'\x01');
      if (pvVar4 != (void *)0x0) {
        psVar5 = (sqlite3_vtab *)sqlite3_mprintf("%s",pvVar4);
        pVtabCursor[(ulong)((bVar1 & 0x20) == 0) + uVar7 + 3].pVtab = psVar5;
        if (psVar5 == (sqlite3_vtab *)0x0) goto LAB_0015e614;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
  }
  local_58._20_4_ = *(u32 *)((long)&(psVar2[1].pModule)->xRollback + 4);
  local_58._16_4_ = 0;
  local_58._0_8_ = (sqlite3 *)0x0;
  local_58._8_8_ = (char *)0x0;
  local_58._24_8_ = local_58._24_8_ & 0xffff000000000000;
  sqlite3_str_append((sqlite3_str *)local_58,"PRAGMA ",7);
  if (pVtabCursor[4].pVtab != (sqlite3_vtab *)0x0) {
    sqlite3_str_appendf((StrAccum *)local_58,"%Q.");
  }
  sqlite3_str_appendall((sqlite3_str *)local_58,(char *)**(undefined8 **)&psVar2[1].nRef);
  if (pVtabCursor[3].pVtab != (sqlite3_vtab *)0x0) {
    sqlite3_str_appendf((StrAccum *)local_58,"=%Q");
  }
  pcVar6 = sqlite3StrAccumFinish((StrAccum *)local_58);
  if (pcVar6 == (char *)0x0) {
LAB_0015e614:
    iVar3 = 7;
  }
  else {
    iVar3 = sqlite3LockAndPrepare
                      ((sqlite3 *)psVar2[1].pModule,pcVar6,-1,0x80,(Vdbe *)0x0,
                       (sqlite3_stmt **)(pVtabCursor + 1),(char **)0x0);
    sqlite3_free(pcVar6);
    if (iVar3 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        iVar3 = pragmaVtabNext(pVtabCursor);
        return iVar3;
      }
      goto LAB_0015e65d;
    }
    pcVar6 = sqlite3_errmsg((sqlite3 *)psVar2[1].pModule);
    pcVar6 = sqlite3_mprintf("%s",pcVar6);
    psVar2->zErrMsg = pcVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
LAB_0015e65d:
  __stack_chk_fail();
}

Assistant:

static int pragmaVtabFilter(
  sqlite3_vtab_cursor *pVtabCursor,
  int idxNum, const char *idxStr,
  int argc, sqlite3_value **argv
){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  PragmaVtab *pTab = (PragmaVtab*)(pVtabCursor->pVtab);
  int rc;
  int i, j;
  StrAccum acc;
  char *zSql;

  UNUSED_PARAMETER(idxNum);
  UNUSED_PARAMETER(idxStr);
  pragmaVtabCursorClear(pCsr);
  j = (pTab->pName->mPragFlg & PragFlg_Result1)!=0 ? 0 : 1;
  for(i=0; i<argc; i++, j++){
    const char *zText = (const char*)sqlite3_value_text(argv[i]);
    assert( j<ArraySize(pCsr->azArg) );
    assert( pCsr->azArg[j]==0 );
    if( zText ){
      pCsr->azArg[j] = sqlite3_mprintf("%s", zText);
      if( pCsr->azArg[j]==0 ){
        return SQLITE_NOMEM;
      }
    }
  }
  sqlite3StrAccumInit(&acc, 0, 0, 0, pTab->db->aLimit[SQLITE_LIMIT_SQL_LENGTH]);
  sqlite3_str_appendall(&acc, "PRAGMA ");
  if( pCsr->azArg[1] ){
    sqlite3_str_appendf(&acc, "%Q.", pCsr->azArg[1]);
  }
  sqlite3_str_appendall(&acc, pTab->pName->zName);
  if( pCsr->azArg[0] ){
    sqlite3_str_appendf(&acc, "=%Q", pCsr->azArg[0]);
  }
  zSql = sqlite3StrAccumFinish(&acc);
  if( zSql==0 ) return SQLITE_NOMEM;
  rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pCsr->pPragma, 0);
  sqlite3_free(zSql);
  if( rc!=SQLITE_OK ){
    pTab->base.zErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pTab->db));
    return rc;
  }
  return pragmaVtabNext(pVtabCursor);
}